

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool AfterSpace(Lexer *lexer,Node *node)

{
  Bool BVar1;
  Node *node_local;
  Lexer *lexer_local;
  
  BVar1 = prvTidynodeCMIsEmpty(node);
  BVar1 = AfterSpaceImp(lexer,node,BVar1);
  return BVar1;
}

Assistant:

static Bool AfterSpace(Lexer *lexer, Node *node)
{
    return AfterSpaceImp(lexer, node, TY_(nodeCMIsEmpty)(node));
}